

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void testing::Test::RecordProperty(string *key,int value)

{
  string *key_00;
  Message value_message;
  string *in_stack_ffffffffffffff68;
  Message *in_stack_ffffffffffffff70;
  Message *in_stack_ffffffffffffff78;
  allocator<char> local_69;
  string local_68 [8];
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string local_48 [72];
  
  Message::Message((Message *)in_stack_ffffffffffffffa0);
  Message::operator<<(in_stack_ffffffffffffff70,(int *)in_stack_ffffffffffffff68);
  Message::GetString_abi_cxx11_(in_stack_ffffffffffffff78);
  key_00 = (string *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  RecordProperty(key_00,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string(local_68);
  Message::~Message((Message *)0x11f1ad);
  return;
}

Assistant:

void Test::RecordProperty(const std::string& key, int value) {
  Message value_message;
  value_message << value;
  RecordProperty(key, value_message.GetString().c_str());
}